

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

WW<3UL> * __thiscall GF2::WW<9ul>::GetHi<3ul>(WW<9UL> *this,WW<3UL> *w)

{
  WW<3UL> *in_RSI;
  ulong *in_RDI;
  size_t offset;
  size_t pos;
  size_t start;
  
  in_RSI->_words[0] = *in_RDI >> 6;
  WW<3UL>::Trim(in_RSI);
  return in_RSI;
}

Assistant:

WW<_m>& GetHi(WW<_m>& w) const
	{
		static_assert(_m <= _n);
		// первое слово, в котором начинается правая часть
		size_t start = (_n - _m) / B_PER_W;
		// правая часть начинается посередине слова (со смещением offset)?
		size_t pos;
		if (size_t offset = (_n - _m) % B_PER_W)
		{
			// объединять биты двух последовательных слов
			for (pos = 0; pos + start + 1 < _wcount; pos++)
				w._words[pos] = (_words[pos + start] >> offset) | 
					(_words[pos + start + 1] << (B_PER_W - offset));
			// использовать биты последнего слова
			if (pos < w._wcount)
				w._words[pos] = _words[pos + start] >> offset;
			w.Trim();
		}
		else
			for (pos = 0; pos < w._wcount; ++pos)
				w._words[pos] = _words[pos + start];
		return w;
	}